

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O3

DdNode * Llb_ManConstructQuantCubeIntern(Llb_Man_t *p,Llb_Grp_t *pGroup,int iGrpPlace,int fBackward)

{
  int iVar1;
  int iVar2;
  int iVar3;
  DdManager *dd;
  abctime aVar4;
  int *piVar5;
  DdNode *pDVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  long lVar9;
  DdNode *pDVar10;
  
  dd = p->dd;
  aVar4 = dd->TimeStop;
  dd->TimeStop = 0;
  pDVar6 = Cudd_ReadOne(dd);
  Cudd_Ref(pDVar6);
  pVVar7 = pGroup->vIns;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    pDVar10 = pDVar6;
    do {
      piVar5 = (int *)pVVar7->pArray[lVar9];
      pDVar6 = pDVar10;
      if (((fBackward == 0) || ((piVar5[6] & 7U) != 2)) || (p->pAig->nTruePis <= *piVar5)) {
        iVar1 = piVar5[9];
        lVar8 = (long)iVar1;
        if (((lVar8 < 0) || (p->vVarBegs->nSize <= iVar1)) || (p->vVarEnds->nSize <= iVar1))
        goto LAB_00825fd3;
        iVar2 = p->vVarEnds->pArray[lVar8];
        iVar3 = p->vVarBegs->pArray[lVar8];
        if (iVar2 < iVar3) {
          __assert_fail("iGroupFirst <= iGroupLast",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb1Reach.c"
                        ,0xa9,
                        "DdNode *Llb_ManConstructQuantCubeIntern(Llb_Man_t *, Llb_Grp_t *, int, int)"
                       );
        }
        if (iVar2 <= iVar3) {
          if (p->vObj2Var->nSize <= iVar1) goto LAB_00825fd3;
          pDVar6 = Cudd_bddIthVar(p->dd,p->vObj2Var->pArray[lVar8]);
          pDVar6 = Cudd_bddAnd(p->dd,pDVar10,pDVar6);
          Cudd_Ref(pDVar6);
          Cudd_RecursiveDeref(p->dd,pDVar10);
          pVVar7 = pGroup->vIns;
        }
      }
      lVar9 = lVar9 + 1;
      pDVar10 = pDVar6;
    } while (lVar9 < pVVar7->nSize);
  }
  pVVar7 = pGroup->vOuts;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    pDVar10 = pDVar6;
    do {
      piVar5 = (int *)pVVar7->pArray[lVar9];
      pDVar6 = pDVar10;
      if (((fBackward == 0) || ((piVar5[6] & 7U) != 2)) || (p->pAig->nTruePis <= *piVar5)) {
        iVar1 = piVar5[9];
        lVar8 = (long)iVar1;
        if (((lVar8 < 0) || (p->vVarBegs->nSize <= iVar1)) || (p->vVarEnds->nSize <= iVar1)) {
LAB_00825fd3:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = p->vVarEnds->pArray[lVar8];
        iVar3 = p->vVarBegs->pArray[lVar8];
        if (iVar2 < iVar3) {
          __assert_fail("iGroupFirst <= iGroupLast",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb1Reach.c"
                        ,0xb6,
                        "DdNode *Llb_ManConstructQuantCubeIntern(Llb_Man_t *, Llb_Grp_t *, int, int)"
                       );
        }
        if (iVar2 <= iVar3) {
          if (p->vObj2Var->nSize <= iVar1) goto LAB_00825fd3;
          pDVar6 = Cudd_bddIthVar(p->dd,p->vObj2Var->pArray[lVar8]);
          pDVar6 = Cudd_bddAnd(p->dd,pDVar10,pDVar6);
          Cudd_Ref(pDVar6);
          Cudd_RecursiveDeref(p->dd,pDVar10);
          pVVar7 = pGroup->vOuts;
        }
      }
      lVar9 = lVar9 + 1;
      pDVar10 = pDVar6;
    } while (lVar9 < pVVar7->nSize);
  }
  Cudd_Deref(pDVar6);
  p->dd->TimeStop = aVar4;
  return pDVar6;
}

Assistant:

DdNode * Llb_ManConstructQuantCubeIntern( Llb_Man_t * p, Llb_Grp_t * pGroup, int iGrpPlace, int fBackward )
{
    Aig_Obj_t * pObj;
    DdNode * bRes, * bTemp, * bVar;
    int i, iGroupFirst, iGroupLast;
    abctime TimeStop;
    TimeStop = p->dd->TimeStop; p->dd->TimeStop = 0;
    bRes = Cudd_ReadOne( p->dd );   Cudd_Ref( bRes );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
    {
        if ( fBackward && Saig_ObjIsPi(p->pAig, pObj) )
            continue;
        iGroupFirst = Vec_IntEntry(p->vVarBegs, Aig_ObjId(pObj));
        iGroupLast  = Vec_IntEntry(p->vVarEnds, Aig_ObjId(pObj));
        assert( iGroupFirst <= iGroupLast );
        if ( iGroupFirst < iGroupLast )
            continue;
        bVar  = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
    {
        if ( fBackward && Saig_ObjIsPi(p->pAig, pObj) )
            continue;
        iGroupFirst = Vec_IntEntry(p->vVarBegs, Aig_ObjId(pObj));
        iGroupLast  = Vec_IntEntry(p->vVarEnds, Aig_ObjId(pObj));
        assert( iGroupFirst <= iGroupLast );
        if ( iGroupFirst < iGroupLast )
            continue;
        bVar  = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Cudd_Deref( bRes );
    p->dd->TimeStop = TimeStop;
    return bRes;
}